

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86inst.cpp
# Opt level: O2

uint32_t asmjit::X86Inst::getIdByName(char *name,size_t len)

{
  long lVar1;
  byte *pbVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  undefined1 *puVar6;
  long lVar7;
  ulong uVar8;
  uint32_t uVar9;
  size_t i;
  size_t sVar10;
  
  uVar9 = 0;
  if (name != (char *)0x0) {
    if (len == 0xffffffffffffffff) {
      len = strlen(name);
    }
    if ((0xffffffffffffffef < len - 0x11) && (uVar3 = (int)*name - 0x61, uVar9 = 0, uVar3 < 0x1a)) {
      uVar4 = (ulong)*(ushort *)(X86InstNameAZ + (ulong)uVar3 * 4);
      if (uVar4 != 0) {
        puVar6 = X86InstDB::instData + uVar4 * 0xc;
        uVar4 = *(ushort *)(X86InstNameAZ + (ulong)uVar3 * 4 + 2) - uVar4;
LAB_00156972:
        do {
          if (uVar4 == 0) {
            return 0;
          }
          sVar10 = 0;
          lVar7 = (uVar4 >> 1) * 0xc;
          uVar8 = (ulong)(*(uint *)(puVar6 + lVar7) >> 8 & 0x3fff);
          do {
            if (len == sVar10) {
              iVar5 = (int)(char)(&X86InstDB::nameData)[uVar8 + len];
              break;
            }
            lVar1 = uVar8 + sVar10;
            pbVar2 = (byte *)(name + sVar10);
            sVar10 = sVar10 + 1;
            iVar5 = (uint)(byte)(&X86InstDB::nameData)[lVar1] - (uint)*pbVar2;
          } while (iVar5 == 0);
          if (iVar5 < 0) {
            puVar6 = puVar6 + lVar7 + 0xc;
            uVar4 = uVar4 - 1 >> 1;
            goto LAB_00156972;
          }
          uVar4 = uVar4 >> 1;
        } while (iVar5 != 0);
        uVar9 = (uint32_t)((long)(puVar6 + lVar7 + -0x15d850) / 0xc);
      }
    }
  }
  return uVar9;
}

Assistant:

uint32_t X86Inst::getIdByName(const char* name, size_t len) noexcept {
  if (ASMJIT_UNLIKELY(!name))
    return Inst::kIdNone;

  if (len == Globals::kInvalidIndex)
    len = ::strlen(name);

  if (ASMJIT_UNLIKELY(len == 0 || len > kX86InstMaxLength))
    return Inst::kIdNone;

  uint32_t prefix = static_cast<uint32_t>(name[0]) - 'a';
  if (ASMJIT_UNLIKELY(prefix > 'z' - 'a'))
    return Inst::kIdNone;

  uint32_t index = X86InstNameAZ[prefix].start;
  if (ASMJIT_UNLIKELY(!index))
    return Inst::kIdNone;

  const char* nameData = X86InstDB::nameData;
  const X86Inst* instData = X86InstDB::instData;

  const X86Inst* base = instData + index;
  const X86Inst* end  = instData + X86InstNameAZ[prefix].end;

  for (size_t lim = (size_t)(end - base); lim != 0; lim >>= 1) {
    const X86Inst* cur = base + (lim >> 1);
    int result = Utils::cmpInstName(nameData + cur[0].getNameDataIndex(), name, len);

    if (result < 0) {
      base = cur + 1;
      lim--;
      continue;
    }

    if (result > 0)
      continue;

    return static_cast<uint32_t>((size_t)(cur - instData));
  }

  return Inst::kIdNone;
}